

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O2

void __thiscall
Privkey_FromWif_mainnet_compressed_Test::~Privkey_FromWif_mainnet_compressed_Test
          (Privkey_FromWif_mainnet_compressed_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, FromWif_mainnet_compressed) {
  std::string wif = "KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG";
  Privkey privkey = Privkey::FromWif(wif, NetType::kMainnet, true);
  EXPECT_STREQ(
      privkey.GetHex().c_str(),
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");

  Privkey from_hex("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  EXPECT_TRUE(privkey.Equals(from_hex));

  EXPECT_STREQ(
      privkey.GetPubkey().GetHex().c_str(),
      "031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_STREQ(privkey.GetWif().c_str(), wif.c_str());
}